

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clockbounds.cc
# Opt level: O0

void __thiscall tchecker::clockbounds::global_m_map_t::~global_m_map_t(global_m_map_t *this)

{
  global_m_map_t *this_local;
  
  clear(this);
  return;
}

Assistant:

global_m_map_t::~global_m_map_t() { clear(); }